

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int ERKStepSetTable(void *arkode_mem,ARKodeButcherTable B)

{
  ARKodeButcherTable pAVar1;
  undefined4 *in_RSI;
  int retval;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  long local_30;
  ARKodeButcherTable in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  int local_4;
  
  local_4 = erkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffc8,
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,(ARKodeERKStepMem *)0x14e0b9);
  if (local_4 == 0) {
    if (in_RSI == (undefined4 *)0x0) {
      arkProcessError(local_20,-0x15,0x3a,"ERKStepSetTable",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep_io.c"
                      ,"arkode_mem = NULL illegal.");
      local_4 = -0x15;
    }
    else {
      *(undefined4 *)&in_stack_ffffffffffffffd8->b = 0;
      *(undefined4 *)&in_stack_ffffffffffffffd8->c = 0;
      *(undefined4 *)((long)&in_stack_ffffffffffffffd8->c + 4) = 0;
      ARKodeButcherTable_Space
                ((ARKodeButcherTable)in_stack_ffffffffffffffd8->d,
                 (sunindextype *)&stack0xffffffffffffffc8,&local_30);
      ARKodeButcherTable_Free((ARKodeButcherTable)CONCAT44(local_4,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffffd8->d = (sunrealtype *)0x0;
      local_20->liw = local_20->liw - (long)in_stack_ffffffffffffffc8;
      local_20->lrw = local_20->lrw - local_30;
      *(undefined4 *)&in_stack_ffffffffffffffd8->b = in_RSI[2];
      *(undefined4 *)&in_stack_ffffffffffffffd8->c = *in_RSI;
      *(undefined4 *)((long)&in_stack_ffffffffffffffd8->c + 4) = in_RSI[1];
      pAVar1 = ARKodeButcherTable_Copy(in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffd8->d = (sunrealtype *)pAVar1;
      if (in_stack_ffffffffffffffd8->d == (sunrealtype *)0x0) {
        arkProcessError(local_20,-0x15,0x53,"ERKStepSetTable",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep_io.c"
                        ,"arkode_mem = NULL illegal.");
        local_4 = -0x15;
      }
      else {
        ARKodeButcherTable_Space
                  ((ARKodeButcherTable)in_stack_ffffffffffffffd8->d,
                   (sunindextype *)&stack0xffffffffffffffc8,&local_30);
        local_20->liw = (long)in_stack_ffffffffffffffc8 + local_20->liw;
        local_20->lrw = local_30 + local_20->lrw;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int ERKStepSetTable(void* arkode_mem, ARKodeButcherTable B)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeMem and ARKodeERKStepMem structures */
  retval = erkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check for legal inputs */
  if (B == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q      = 0;
  step_mem->p      = 0;

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->B);
  step_mem->B = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /* set the relevant parameters */
  step_mem->stages = B->stages;
  step_mem->q      = B->q;
  step_mem->p      = B->p;

  /* copy the table into step memory */
  step_mem->B = ARKodeButcherTable_Copy(B);
  if (step_mem->B == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  return (ARK_SUCCESS);
}